

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNandRFC822nameConstraintsTest28<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section13InvalidDNandRFC822nameConstraintsTest28<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_d8 [8];
  PkitsTestInfo info;
  char *crls [3];
  char *pcStack_38;
  char *certs [4];
  Section13InvalidDNandRFC822nameConstraintsTest28<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  certs[1] = "nameConstraintsDN1subCA3Cert";
  certs[2] = "InvalidDNandRFC822nameConstraintsTest28EE";
  pcStack_38 = "TrustAnchorRootCertificate";
  certs[0] = "nameConstraintsDN1CACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_d8);
  local_d8 = (undefined1  [8])0x6f71f8;
  info.time.year._0_1_ = 0;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [4])&pcStack_38,
             (char *(*) [3])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_d8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_d8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNandRFC822nameConstraintsTest28) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN1CACert",
                               "nameConstraintsDN1subCA3Cert",
                               "InvalidDNandRFC822nameConstraintsTest28EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN1CACRL",
                              "nameConstraintsDN1subCA3CRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.28";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}